

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O0

void __thiscall
QSplitterPrivate::getRange
          (QSplitterPrivate *this,int index,int *farMin,int *min,int *max,int *farMax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QSplitterPrivate *this_00;
  qsizetype qVar5;
  int *piVar6;
  int *in_RCX;
  int *in_RDX;
  int in_ESI;
  QSplitterPrivate *in_RDI;
  int *in_R8;
  int *in_R9;
  long in_FS_OFFSET;
  int smartMaxBefore;
  int smartMinBefore;
  int farMaxVal;
  int maxVal;
  int minVal;
  int farMinVal;
  int i;
  int idJustAfter;
  int idJustBefore;
  int n;
  QSplitter *q;
  QRect r;
  int maxAfter;
  int maxBefore;
  int minAfter;
  int minBefore;
  int collapsibleSizeAfter;
  int collapsibleSizeBefore;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int iVar9;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  int local_40;
  QSize local_3c;
  int local_34;
  undefined1 local_30 [16];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSplitterPrivate *)q_func(in_RDI);
  qVar5 = QList<QSplitterLayoutStruct_*>::size(&in_RDI->list);
  iVar4 = (int)qVar5;
  if ((0 < in_ESI) && (in_ESI < iVar4)) {
    local_c = 0;
    iVar1 = findWidgetJustBeforeOrJustAfter
                      ((QSplitterPrivate *)CONCAT44(iVar4,in_stack_ffffffffffffff58),
                       in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,
                       (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    local_10 = 0;
    iVar1 = findWidgetJustBeforeOrJustAfter
                      ((QSplitterPrivate *)CONCAT44(iVar4,iVar1),in_stack_ffffffffffffff54,
                       in_stack_ffffffffffffff50,
                       (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    local_14 = 0;
    local_18 = 0;
    local_1c = 0;
    local_20 = 0;
    for (iVar9 = 0; iVar9 < in_ESI; iVar9 = iVar9 + 1) {
      addContribution(this_00,iVar4,(int *)CONCAT44(iVar1,iVar9),
                      (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                      SUB41((uint)in_stack_ffffffffffffff44 >> 0x18,0));
    }
    for (; in_ESI < iVar4; in_ESI = in_ESI + 1) {
      addContribution(this_00,iVar4,(int *)CONCAT44(iVar1,in_ESI),
                      (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                      SUB41((uint)in_stack_ffffffffffffff44 >> 0x18,0));
    }
    local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_30._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = (undefined1  [16])
               QWidget::contentsRect
                         ((QWidget *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    uVar8 = 0xaaaaaaaa;
    uVar7 = 0xaaaaaaaa;
    local_3c = QRect::size((QRect *)&DAT_aaaaaaaaaaaaaaaa);
    local_34 = pick(in_RDI,(QSize *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_34 = local_34 - local_20;
    piVar6 = qMax<int>(&local_14,&local_34);
    iVar4 = *piVar6;
    QRect::size((QRect *)CONCAT44(uVar8,uVar7));
    local_40 = pick(in_RDI,(QSize *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_40 = local_40 - local_18;
    piVar6 = qMin<int>(&local_1c,&local_40);
    iVar1 = *piVar6;
    QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    iVar9 = pick(in_RDI,(QPoint *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    iVar9 = iVar9 + iVar4;
    QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    iVar2 = pick(in_RDI,(QPoint *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    iVar2 = iVar2 + iVar1;
    iVar1 = local_14 - local_c;
    iVar4 = iVar9;
    QRect::size((QRect *)CONCAT44(iVar2,uVar7));
    iVar3 = pick(in_RDI,(QSize *)CONCAT44(iVar1,in_stack_ffffffffffffff28));
    if (iVar3 - local_20 <= iVar1) {
      iVar4 = iVar4 - local_c;
    }
    iVar3 = iVar2;
    QRect::size((QRect *)CONCAT44(iVar2,iVar2));
    iVar1 = pick(in_RDI,(QSize *)CONCAT44(iVar1,in_stack_ffffffffffffff28));
    if (iVar1 - (local_18 - local_10) <= local_1c) {
      iVar2 = local_10 + iVar2;
    }
    if (in_RDX != (int *)0x0) {
      *in_RDX = iVar4;
    }
    if (in_RCX != (int *)0x0) {
      *in_RCX = iVar9;
    }
    if (in_R8 != (int *)0x0) {
      *in_R8 = iVar3;
    }
    if (in_R9 != (int *)0x0) {
      *in_R9 = iVar2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSplitterPrivate::getRange(int index, int *farMin, int *min, int *max, int *farMax) const
{
    Q_Q(const QSplitter);
    int n = list.size();
    if (index <= 0 || index >= n)
        return;

    int collapsibleSizeBefore = 0;
    int idJustBefore = findWidgetJustBeforeOrJustAfter(index, -1, collapsibleSizeBefore);

    int collapsibleSizeAfter = 0;
    int idJustAfter = findWidgetJustBeforeOrJustAfter(index, +1, collapsibleSizeAfter);

    int minBefore = 0;
    int minAfter = 0;
    int maxBefore = 0;
    int maxAfter = 0;
    int i;

    for (i = 0; i < index; ++i)
        addContribution(i, &minBefore, &maxBefore, i == idJustBefore);
    for (i = index; i < n; ++i)
        addContribution(i, &minAfter, &maxAfter, i == idJustAfter);

    QRect r = q->contentsRect();
    int farMinVal;
    int minVal;
    int maxVal;
    int farMaxVal;

    int smartMinBefore = qMax(minBefore, pick(r.size()) - maxAfter);
    int smartMaxBefore = qMin(maxBefore, pick(r.size()) - minAfter);

    minVal = pick(r.topLeft()) + smartMinBefore;
    maxVal = pick(r.topLeft()) + smartMaxBefore;

    farMinVal = minVal;
    if (minBefore - collapsibleSizeBefore >= pick(r.size()) - maxAfter)
        farMinVal -= collapsibleSizeBefore;
    farMaxVal = maxVal;
    if (pick(r.size()) - (minAfter - collapsibleSizeAfter) <= maxBefore)
        farMaxVal += collapsibleSizeAfter;

    if (farMin)
        *farMin = farMinVal;
    if (min)
        *min = minVal;
    if (max)
        *max = maxVal;
    if (farMax)
        *farMax = farMaxVal;
}